

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

TokenStringsExt * __thiscall
gl4cts::SparseTexture2LookupTestCase::createLookupShaderTokens
          (TokenStringsExt *__return_storage_ptr__,SparseTexture2LookupTestCase *this,GLint target,
          GLint format,GLint level,GLint sample,FunctionToken *funcToken)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  size_type *psVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  size_type *psVar10;
  SparseTexture2CommitmentTestCase *this_00;
  string *psVar11;
  string *psVar12;
  string funcName;
  string inputType;
  string samplerSufix;
  ostringstream s;
  TokenStrings ss;
  string *local_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  string *local_3c8;
  SparseTexture2CommitmentTestCase *local_3c0;
  char *local_3b8;
  undefined1 local_3b0 [16];
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Alloc_hider local_380;
  string *local_378;
  undefined1 local_370 [8];
  string local_368;
  stringstream *local_348;
  Context *local_340;
  stringstream local_338 [16];
  long *local_328 [2];
  long local_318 [2];
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [3];
  ios_base local_278 [264];
  TokenStrings local_170;
  
  local_3e8[0] = local_3d8;
  pcVar2 = (funcToken->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,pcVar2,pcVar2 + (funcToken->name)._M_string_length);
  (__return_storage_ptr__->super_TokenStrings).format._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).format.field_2;
  (__return_storage_ptr__->super_TokenStrings).format._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).format.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).pointType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).pointType.field_2;
  (__return_storage_ptr__->super_TokenStrings).pointType._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).pointType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).pointDef._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).pointDef.field_2;
  (__return_storage_ptr__->super_TokenStrings).pointDef._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).pointDef.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).outputType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).outputType.field_2;
  (__return_storage_ptr__->super_TokenStrings).outputType._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).outputType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).inputType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).inputType.field_2;
  (__return_storage_ptr__->super_TokenStrings).inputType._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).inputType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).returnType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).returnType.field_2;
  (__return_storage_ptr__->super_TokenStrings).returnType._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).returnType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).resultExpected._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).resultExpected.field_2;
  (__return_storage_ptr__->super_TokenStrings).resultExpected._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).resultExpected.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).resultDefault._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).resultDefault.field_2;
  (__return_storage_ptr__->super_TokenStrings).resultDefault._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).resultDefault.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).epsilon._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).epsilon.field_2;
  (__return_storage_ptr__->super_TokenStrings).epsilon._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).epsilon.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_TokenStrings).sampleDef._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_TokenStrings).sampleDef.field_2;
  (__return_storage_ptr__->super_TokenStrings).sampleDef._M_string_length = 0;
  (__return_storage_ptr__->super_TokenStrings).sampleDef.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->formatDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->formatDef).field_2;
  (__return_storage_ptr__->formatDef)._M_string_length = 0;
  (__return_storage_ptr__->formatDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->sizeDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sizeDef).field_2;
  (__return_storage_ptr__->sizeDef)._M_string_length = 0;
  (__return_storage_ptr__->sizeDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->lod)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->lod).field_2;
  (__return_storage_ptr__->lod)._M_string_length = 0;
  (__return_storage_ptr__->lod).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->lodDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->lodDef).field_2;
  (__return_storage_ptr__->lodDef)._M_string_length = 0;
  (__return_storage_ptr__->lodDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->coordType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->coordType).field_2;
  (__return_storage_ptr__->coordType)._M_string_length = 0;
  (__return_storage_ptr__->coordType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->iCoordType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->iCoordType).field_2;
  (__return_storage_ptr__->iCoordType)._M_string_length = 0;
  (__return_storage_ptr__->iCoordType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->coordDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->coordDef).field_2;
  (__return_storage_ptr__->coordDef)._M_string_length = 0;
  (__return_storage_ptr__->coordDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cubeMapCoordDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->cubeMapCoordDef).field_2;
  (__return_storage_ptr__->cubeMapCoordDef)._M_string_length = 0;
  (__return_storage_ptr__->cubeMapCoordDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->refZDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->refZDef).field_2;
  (__return_storage_ptr__->refZDef)._M_string_length = 0;
  (__return_storage_ptr__->refZDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->offsetDim)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->offsetDim).field_2;
  (__return_storage_ptr__->offsetDim)._M_string_length = 0;
  (__return_storage_ptr__->offsetDim).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->offsetType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->offsetType).field_2;
  (__return_storage_ptr__->offsetType)._M_string_length = 0;
  (__return_storage_ptr__->offsetType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nOffsetType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nOffsetType).field_2;
  (__return_storage_ptr__->nOffsetType)._M_string_length = 0;
  (__return_storage_ptr__->nOffsetType).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->componentDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->componentDef).field_2;
  (__return_storage_ptr__->componentDef)._M_string_length = 0;
  (__return_storage_ptr__->componentDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->offsetArrayDef)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->offsetArrayDef).field_2;
  (__return_storage_ptr__->offsetArrayDef)._M_string_length = 0;
  (__return_storage_ptr__->offsetArrayDef).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->pointCoord)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pointCoord).field_2;
  (__return_storage_ptr__->pointCoord)._M_string_length = 0;
  (__return_storage_ptr__->pointCoord).field_2._M_local_buf[0] = '\0';
  local_3c0 = (SparseTexture2CommitmentTestCase *)local_3b0;
  local_3b8 = (char *)0x0;
  local_3b0[0] = 0;
  local_348 = local_338;
  local_340 = (Context *)0x0;
  local_338[0] = (stringstream)0x0;
  iVar3 = std::__cxx11::string::compare((char *)local_3e8);
  pcVar7 = "sampler";
  if (iVar3 == 0) {
    pcVar7 = "image";
  }
  std::__cxx11::string::_M_replace((ulong)&local_3c0,0,local_3b8,(ulong)pcVar7);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_370 + 8),"image","");
  this_00 = local_3c0;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_3c0,local_3b8 + (long)local_3c0);
  SparseTexture2CommitmentTestCase::createShaderTokens
            (&local_170,this_00,target,format,sample,(string *)(local_370 + 8),&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).epsilon);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  psVar1 = &(__return_storage_ptr__->super_TokenStrings).inputType;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).outputType);
  local_370 = (undefined1  [8])&(__return_storage_ptr__->super_TokenStrings).pointDef;
  std::__cxx11::string::_M_assign((string *)local_370);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).pointType)
  ;
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).resultDefault);
  local_3c8 = &(__return_storage_ptr__->super_TokenStrings).resultExpected;
  std::__cxx11::string::_M_assign((string *)local_3c8);
  std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->super_TokenStrings).returnType);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->super_TokenStrings).sampleDef)
  ;
  iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
  if (iVar3 == 0) {
    std::operator+(local_2e8,", ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->formatDef,(string *)local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8[0]._M_dataplus._M_p != &local_2e8[0].field_2) {
      operator_delete(local_2e8[0]._M_dataplus._M_p,local_2e8[0].field_2._M_allocated_capacity + 1);
    }
  }
  if (format == 0x81a5) {
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->refZDef,0,
               (char *)(__return_storage_ptr__->refZDef)._M_string_length,0x1af0751);
    iVar3 = std::__cxx11::string::compare((char *)&local_3c0);
    if ((((iVar3 == 0) && (target != 0x806f)) && (target != 0x9100)) && (target != 0x9102)) {
      pcVar2 = (__return_storage_ptr__->super_TokenStrings).inputType._M_dataplus._M_p;
      local_2e8[0]._M_dataplus._M_p = (pointer)&local_2e8[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,pcVar2,
                 pcVar2 + (__return_storage_ptr__->super_TokenStrings).inputType._M_string_length);
      std::__cxx11::string::append((char *)local_2e8);
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8[0]._M_dataplus._M_p != &local_2e8[0].field_2) {
        operator_delete(local_2e8[0]._M_dataplus._M_p,local_2e8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  psVar1 = &__return_storage_ptr__->coordType;
  pcVar9 = "vec2";
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(__return_storage_ptr__->coordType)._M_string_length,0x1b66e24)
  ;
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->offsetType,0,
             (char *)(__return_storage_ptr__->offsetType)._M_string_length,0x1c319c7);
  local_378 = &__return_storage_ptr__->nOffsetType;
  std::__cxx11::string::_M_replace
            ((ulong)local_378,0,(char *)(__return_storage_ptr__->nOffsetType)._M_string_length,
             0x1c0039d);
  psVar12 = &__return_storage_ptr__->offsetDim;
  std::__cxx11::string::_M_replace
            ((ulong)psVar12,0,(char *)(__return_storage_ptr__->offsetDim)._M_string_length,0x1ad5b62
            );
  local_3f0 = &__return_storage_ptr__->coordDef;
  psVar4 = &(__return_storage_ptr__->coordType)._M_string_length;
  psVar10 = &(__return_storage_ptr__->offsetDim)._M_string_length;
  pcVar7 = "vec3";
  local_380._M_p = (pointer)psVar4;
  if (target < 0x8c18) {
    if (target == 0xde0) {
      pcVar9 = "float";
LAB_00a6e8fe:
      std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar4,(ulong)pcVar9);
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->offsetType,0,
                 (char *)(__return_storage_ptr__->offsetType)._M_string_length,0x1c86081);
      std::__cxx11::string::_M_replace
                ((ulong)local_378,0,(char *)(__return_storage_ptr__->nOffsetType)._M_string_length,
                 0x1b10a98);
      pcVar7 = "";
    }
    else {
      psVar11 = psVar1;
      if ((target != 0x806f) && (target != 0x8513)) goto LAB_00a6ea21;
LAB_00a6e9a2:
      std::__cxx11::string::_M_replace((ulong)psVar11,0,(char *)*psVar4,(ulong)pcVar7);
      pcVar7 = "3";
    }
LAB_00a6e9bc:
    std::__cxx11::string::_M_replace((ulong)psVar12,0,(char *)*psVar10,(ulong)pcVar7);
    if (((target == 0x9009) || (target == 0x8513)) &&
       (lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1a37448,0), lVar5 == -1)) {
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->cubeMapCoordDef,0,
                 (char *)(__return_storage_ptr__->cubeMapCoordDef)._M_string_length,0x1af07ad);
    }
  }
  else {
    if (0x9008 < target) {
      if (target == 0x9009) {
        std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar4,0x1b66e62);
        psVar4 = &(__return_storage_ptr__->coordDef)._M_string_length;
        pcVar7 = 
        "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6, floor(gl_WorkGroupID.z / 6)";
        psVar11 = local_3f0;
        goto LAB_00a6e9a2;
      }
      psVar10 = psVar4;
      psVar12 = psVar1;
      if (target != 0x9102) goto LAB_00a6ea21;
      goto LAB_00a6e9bc;
    }
    if (target == 0x8c18) goto LAB_00a6e8fe;
    psVar10 = psVar4;
    psVar12 = psVar1;
    if (target == 0x8c1a) goto LAB_00a6e9bc;
  }
LAB_00a6ea21:
  if ((__return_storage_ptr__->coordDef)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)local_3f0);
  }
  lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1bb864b,0);
  if (lVar5 == -1) {
    if (format == 0x81a5) {
      if (target == 0x9009) {
        local_3f0 = &funcToken->arguments;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          pcVar7 = "Test 8 vec3";
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar3 != 0) goto LAB_00a6eb6b;
          pcVar7 = "Test 8 vec4";
        }
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,*(char **)local_380._M_p,(ulong)(pcVar7 + 7));
      }
LAB_00a6eb6b:
      std::__cxx11::string::_M_append
                ((char *)local_3f0,(ulong)(__return_storage_ptr__->refZDef)._M_dataplus._M_p);
      pcVar7 = ".r";
      lVar5 = 0x2c8;
      local_3c8 = &__return_storage_ptr__->componentDef;
      goto LAB_00a6eb9b;
    }
  }
  else {
    lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1cbe6bd,0);
    if (lVar5 != -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->offsetArrayDef,0,
                 (char *)(__return_storage_ptr__->offsetArrayDef)._M_string_length,0x1af0982);
    }
    pcVar7 = "(1, 1, 1, 1)";
    lVar5 = 200;
    if (format != 0x81a5) {
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->componentDef,0,
                 (char *)(__return_storage_ptr__->componentDef)._M_string_length,0x1a356b2);
    }
LAB_00a6eb9b:
    std::__cxx11::string::_M_replace
              ((ulong)local_3c8,0,
               *(char **)((long)&(__return_storage_ptr__->super_TokenStrings).format._M_dataplus.
                                 _M_p + lVar5),(ulong)pcVar7);
  }
  pcVar7 = "icoord";
  if (target != 0x84f5) {
    if ((target != 0x9100) && (target != 0x9102)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
      std::ostream::operator<<(local_2e8,level);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
      std::ios_base::~ios_base(local_278);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->lod,(string *)&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != &local_390) {
        operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
      std::ostream::operator<<(local_2e8,level);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
      std::ios_base::~ios_base(local_278);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x1acdea0);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar8) {
        local_390._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_390._8_8_ = plVar6[3];
        local_3a0._M_p = (pointer)&local_390;
      }
      else {
        local_390._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_3a0._M_p = (pointer)*plVar6;
      }
      local_398 = plVar6[1];
      *plVar6 = (long)paVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->lodDef,(string *)&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p != &local_390) {
        operator_delete(local_3a0._M_p,local_390._M_allocated_capacity + 1);
      }
      if (local_328[0] != local_318) {
        operator_delete(local_328[0],local_318[0] + 1);
      }
      if (target == 0x84f5) goto LAB_00a6edd4;
    }
    lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1a37448,0);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1af0a82,0);
      pcVar7 = "icoord";
      if (lVar5 == -1) {
        pcVar7 = "coord";
      }
    }
  }
LAB_00a6edd4:
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->pointCoord,0,
             (char *)(__return_storage_ptr__->pointCoord)._M_string_length,(ulong)pcVar7);
  if ((format == 0x81a5) &&
     (lVar5 = std::__cxx11::string::find((char *)local_3e8,0x1bb864b,0), lVar5 == -1)) {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if ((target == 0x8c18) && (iVar3 == 0)) {
      pcVar7 = "<TEX_WIDTH>, <TEX_DEPTH>, 1";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar3 == 0) {
        pcVar7 = "<TEX_WIDTH>, <TEX_HEIGHT>, 1";
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 != 0) goto LAB_00a6ef6f;
        pcVar7 = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>, 1";
      }
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) {
      pcVar7 = "<TEX_WIDTH>";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if ((target == 0x8c18) && (iVar3 == 0)) {
        pcVar7 = "<TEX_WIDTH>, <TEX_DEPTH>";
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar3 == 0) {
          pcVar7 = "<TEX_WIDTH>, <TEX_HEIGHT>";
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar3 == 0) {
            pcVar7 = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>";
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar3 != 0) goto LAB_00a6ef6f;
            pcVar7 = "<TEX_WIDTH>, <TEX_HEIGHT>, floor(<TEX_DEPTH> / 6), 6";
          }
        }
      }
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->sizeDef,0,
             (char *)(__return_storage_ptr__->sizeDef)._M_string_length,(ulong)pcVar7);
LAB_00a6ef6f:
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->iCoordType,0,
               (char *)(__return_storage_ptr__->iCoordType)._M_string_length,0x1c86081);
  }
  else {
    std::operator+(local_2e8,"i",psVar1);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->iCoordType,(string *)local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8[0]._M_dataplus._M_p != &local_2e8[0].field_2) {
      operator_delete(local_2e8[0]._M_dataplus._M_p,local_2e8[0].field_2._M_allocated_capacity + 1);
    }
  }
  SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&local_170);
  if (local_348 != local_338) {
    operator_delete(local_348,CONCAT71(local_338._1_7_,local_338[0]) + 1);
  }
  if (local_3c0 != (SparseTexture2CommitmentTestCase *)local_3b0) {
    operator_delete(local_3c0,CONCAT71(local_3b0._1_7_,local_3b0[0]) + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2LookupTestCase::TokenStringsExt SparseTexture2LookupTestCase::createLookupShaderTokens(
	GLint target, GLint format, GLint level, GLint sample, FunctionToken& funcToken)
{
	std::string funcName = funcToken.name;

	TokenStringsExt s;

	std::string inputType;
	std::string samplerSufix;

	if (funcName == "sparseImageLoadARB")
		inputType = "image";
	else
		inputType = "sampler";

	// Copy data from TokenStrings to TokenStringsExt
	TokenStrings ss  = createShaderTokens(target, format, sample, "image", inputType);
	s.epsilon		 = ss.epsilon;
	s.format		 = ss.format;
	s.inputType		 = ss.inputType;
	s.outputType	 = ss.outputType;
	s.pointDef		 = ss.pointDef;
	s.pointType		 = ss.pointType;
	s.resultDefault  = ss.resultDefault;
	s.resultExpected = ss.resultExpected;
	s.returnType	 = ss.returnType;
	s.sampleDef		 = ss.sampleDef;

	// Set format definition for image input types
	if (inputType == "image")
		s.formatDef = ", " + s.format;

	// Set tokens for depth texture format
	if (format == GL_DEPTH_COMPONENT16)
	{
		s.refZDef = ", 0.5";

		if (inputType == "sampler" && target != GL_TEXTURE_3D && target != GL_TEXTURE_2D_MULTISAMPLE &&
			target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			s.inputType = s.inputType + "Shadow";
		}
	}

	// Set coord type, coord definition and offset vector dimensions
	s.coordType   = "vec2";
	s.offsetType  = "ivec";
	s.nOffsetType = "vec";
	s.offsetDim   = "2";
	if (target == GL_TEXTURE_1D)
	{
		s.coordType   = "float";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.coordType   = "vec2";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.coordType = "vec3";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.coordType = "vec4";
		s.coordDef  = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6, floor(gl_WorkGroupID.z / 6)";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.coordType = "vec3";
	}

	if ((target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY) &&
		funcName.find("Fetch", 0) == std::string::npos)
	{
		s.cubeMapCoordDef = "    if (point.z == 0) coord.xyz = vec3(1, coord.y * 2 - 1, -coord.x * 2 + 1);\n"
							"    if (point.z == 1) coord.xyz = vec3(-1, coord.y * 2 - 1, coord.x * 2 - 1);\n"
							"    if (point.z == 2) coord.xyz = vec3(coord.x * 2 - 1, 1, coord.y * 2 - 1);\n"
							"    if (point.z == 3) coord.xyz = vec3(coord.x * 2 - 1, -1, -coord.y * 2 + 1);\n"
							"    if (point.z == 4) coord.xyz = vec3(coord.x * 2 - 1, coord.y * 2 - 1, 1);\n"
							"    if (point.z == 5) coord.xyz = vec3(-coord.x * 2 + 1, coord.y * 2 - 1, -1);\n";
	}

	if (s.coordDef.empty())
		s.coordDef = s.pointDef;

	// Set expected result vector, component definition and offset array definition for gather functions
	if (funcName.find("Gather", 0) != std::string::npos)
	{
		if (funcName.find("GatherOffsets", 0) != std::string::npos)
		{
			s.offsetArrayDef = "    <OFFSET_TYPE><OFFSET_DIM> offsetsArray[4];\n"
							   "    offsetsArray[0] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[1] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[2] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[3] = <OFFSET_TYPE><OFFSET_DIM>(0);\n";
		}

		if (format != GL_DEPTH_COMPONENT16)
			s.componentDef = ", 0";
		s.resultExpected   = "(1, 1, 1, 1)";
	}
	// Extend coord type dimension and coord vector definition if shadow sampler and non-cube map array target selected
	// Set component definition to red component
	else if (format == GL_DEPTH_COMPONENT16)
	{
		if (target != GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			if (s.coordType == "vec2")
				s.coordType = "vec3";
			else if (s.coordType == "vec3")
				s.coordType = "vec4";
			s.coordDef += s.refZDef;
		}
		else
			funcToken.arguments += s.refZDef;

		s.componentDef = ".r";
	}

	// Set level of details definition
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.lod	= de::toString(level);
		s.lodDef = ", " + de::toString(level);
	}

	// Set proper coord vector
	if (target == GL_TEXTURE_RECTANGLE || funcName.find("Fetch") != std::string::npos ||
		funcName.find("ImageLoad") != std::string::npos)
	{
		s.pointCoord = "icoord";
	}
	else
		s.pointCoord = "coord";

	// Set size vector definition
	if (format != GL_DEPTH_COMPONENT16 || funcName.find("Gather", 0) != std::string::npos)
	{
		if (s.coordType == "float")
			s.sizeDef = "<TEX_WIDTH>";
		else if (s.coordType == "vec2" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>";
		else if (s.coordType == "vec2")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, floor(<TEX_DEPTH> / 6), 6";
	}
	// Set size vector for shadow samplers and non-gether functions selected
	else
	{
		if (s.coordType == "vec3" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>, 1";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, 1";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>, 1";
	}

	if (s.coordType != "float")
		s.iCoordType = "i" + s.coordType;
	else
		s.iCoordType = "int";

	return s;
}